

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerI2CBus.h
# Opt level: O2

int OpenComputerI2CBus(HANDLE *phDev,char *szDevice)

{
  int iVar1;
  
  iVar1 = open(szDevice,2);
  if (iVar1 != -1) {
    signal(0xd,(__sighandler_t)0x1);
    *phDev = (HANDLE)(long)iVar1;
  }
  return (uint)(iVar1 == -1);
}

Assistant:

inline int OpenComputerI2CBus(HANDLE* phDev, char* szDevice)
{
#if (defined(_WIN32) || (!defined(ENABLE_COMPUTERI2CBUS_SUPPORT)))
	UNREFERENCED_PARAMETER(szDevice);
	*phDev = (HANDLE)-1;
	PRINT_DEBUG_ERROR_OSCOMPUTERI2CBUS(("OpenComputerI2CBus error (%s) : %s"
		"(szDevice=%s)\n",
		strtime_m(),
		szOSUtilsErrMsgs[EXIT_NOT_IMPLEMENTED],
		szDevice));
	return EXIT_NOT_IMPLEMENTED;
#else 
	int fd = open(szDevice, O_RDWR);

	if (fd == -1)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERI2CBUS(("OpenComputerI2CBus error (%s) : %s"
			"(szDevice=%s)\n",
			strtime_m(),
			GetLastErrorMsg(),
			szDevice));
		return EXIT_FAILURE;
	}

	// The read function can be made to return immediately by
	// doing the following :
	// fcntl(fd, F_SETFL, FNDELAY);
	// The FNDELAY option causes the read function to return 0 if no characters are
	// available on the port. To restore normal (blocking) behavior, call fcntl() without
	// the FNDELAY option:
	//if (fcntl(fd, F_SETFL, 0) == (-1))
	//{
	//	PRINT_DEBUG_ERROR_OSCOMPUTERI2CBUS(("OpenComputerI2CBus error (%s) : (F_SETFL) %s"
	//		"(szDevice=%s)\n", 
	//		strtime_m(), 
	//		GetLastErrorMsg(), 
	//		szDevice));
	//	close(fd);
	//	return EXIT_FAILURE;
	//}

#ifndef DISABLE_IGNORE_SIGPIPE
	// See https://stackoverflow.com/questions/17332646/server-dies-on-send-if-client-was-closed-with-ctrlc...
	if (signal(SIGPIPE, SIG_IGN) == SIG_ERR)
	{
		PRINT_DEBUG_WARNING_OSCOMPUTERI2CBUS(("OpenComputerI2CBus warning (%s) : %s"
			"(szDevice=%s)\n",
			strtime_m(),
			"signal failed ",
			szDevice));
	}
#endif // DISABLE_IGNORE_SIGPIPE

	*phDev = (HANDLE)(intptr_t)fd;
	return EXIT_SUCCESS;
#endif // (defined(_WIN32) || (!defined(ENABLE_COMPUTERI2CBUS_SUPPORT)))
}